

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddSelectionMerge
          (InstructionBuilder *this,uint32_t merge_id,uint32_t selection_control)

{
  IRContext *c;
  Instruction *pIVar1;
  pointer pOVar2;
  SmallVector<unsigned_int,_2UL> *this_00;
  long lVar3;
  Operand *__cur;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_branch_merge;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_100;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_f8;
  undefined1 local_e0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_c0;
  undefined1 local_b8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  undefined1 local_58 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_38;
  
  pIVar1 = (Instruction *)operator_new(0x70);
  c = this->context_;
  local_b8._24_8_ = local_b8 + 0x10;
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  local_98._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_b8._8_8_ = 1;
  this_00 = &local_88;
  local_90 = 1;
  local_88._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
  local_88.size_ = 0;
  local_88.small_data_ = (uint *)local_88.buffer;
  local_88.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_b8._16_4_ = merge_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (this_00,(SmallVector<unsigned_int,_2UL> *)local_b8);
  local_e0._24_8_ = local_e0 + 0x10;
  local_e0._0_8_ = &PTR__SmallVector_009488e0;
  local_c0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_e0._8_8_ = 1;
  local_60 = 0x25;
  local_58._0_8_ = &PTR__SmallVector_009488e0;
  local_58._8_8_ = 0;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_e0._16_4_ = selection_control;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_58,(SmallVector<unsigned_int,_2UL> *)local_e0);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 0x60;
  pOVar2 = (pointer)operator_new(0x60);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar2 + 2;
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = pOVar2;
  do {
    pOVar2->type = *(spv_operand_type_t *)
                    &this_00[-1].large_data_._M_t.
                     super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl;
    (pOVar2->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
    (pOVar2->words).size_ = 0;
    (pOVar2->words).small_data_ = (uint *)(pOVar2->words).buffer;
    (pOVar2->words).large_data_._M_t.
    super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=(&pOVar2->words,this_00);
    pOVar2 = pOVar2 + 1;
    this_00 = (SmallVector<unsigned_int,_2UL> *)&this_00[1].size_;
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != 0);
  local_f8.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = pOVar2;
  Instruction::Instruction(pIVar1,c,OpSelectionMerge,0,0,&local_f8);
  local_100._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_f8);
  lVar3 = -0x60;
  this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_38;
  do {
    *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_009488e0;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
    }
    *(undefined8 *)this_01 = 0;
    this_01 = this_01 + -0x30;
    lVar3 = lVar3 + 0x30;
  } while (lVar3 != 0);
  local_e0._0_8_ = &PTR__SmallVector_009488e0;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_c0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_c0,local_c0._M_head_impl);
  }
  local_b8._0_8_ = &PTR__SmallVector_009488e0;
  if (local_98._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_98,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_98._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_100);
  if (local_100._M_head_impl != (Instruction *)0x0) {
    (*((local_100._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddSelectionMerge(
      uint32_t merge_id, uint32_t selection_control = static_cast<uint32_t>(
                             spv::SelectionControlMask::MaskNone)) {
    std::unique_ptr<Instruction> new_branch_merge(new Instruction(
        GetContext(), spv::Op::OpSelectionMerge, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {merge_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_SELECTION_CONTROL,
          {selection_control}}}));
    return AddInstruction(std::move(new_branch_merge));
  }